

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O2

bool __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::push
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this,object_t *node)

{
  object_t *poVar1;
  
  spin_lock::lock(&this->mutex_);
  poVar1 = this->tail_;
  if (poVar1 == (object_t *)0x0) {
    (node->super_node<acto::core::object_t>).next = node;
    poVar1 = node;
  }
  else {
    (node->super_node<acto::core::object_t>).next = (poVar1->super_node<acto::core::object_t>).next;
    (poVar1->super_node<acto::core::object_t>).next = node;
    poVar1 = (node->super_node<acto::core::object_t>).next;
  }
  this->tail_ = node;
  spin_lock::unlock(&this->mutex_);
  return poVar1 == node;
}

Assistant:

bool push(T* const node) {
    std::lock_guard g(mutex_);

    if (tail_) {
      node->next = tail_->next;
      tail_->next = node;
    } else {
      node->next = node;
    }
    tail_ = node;
    return node->next == node;
  }